

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O0

void impute_missing_values<double,long>
               (double *numeric_data,int *categ_data,bool is_col_major,double *Xr,long *Xr_ind,
               long *Xr_indptr,size_t nrows,bool use_long_double,int nthreads,
               IsoForest *model_outputs,ExtIsoForest *model_outputs_ext,Imputer *imputer)

{
  bool bVar1;
  byte in_stack_00000010;
  long *in_stack_000001b8;
  long *in_stack_000001c0;
  double *in_stack_000001c8;
  bool in_stack_000001d7;
  int *in_stack_000001d8;
  double *in_stack_000001e0;
  size_t in_stack_000001f0;
  int in_stack_000001f8;
  IsoForest *in_stack_00000200;
  ExtIsoForest *in_stack_00000208;
  Imputer *in_stack_00000210;
  byte local_41;
  
  local_41 = in_stack_00000010 & 1;
  if (local_41 != 0) {
    bVar1 = has_long_double();
    if (!bVar1) {
      local_41 = 0;
      fprintf(_stderr,"%s",
              "Passed \'use_long_double=true\', but library was compiled without long double support.\n"
             );
    }
  }
  if (((local_41 ^ 0xff) & 1) == 0) {
    impute_missing_values_internal<double,long,long_double>
              (in_stack_000001e0,in_stack_000001d8,in_stack_000001d7,in_stack_000001c8,
               in_stack_000001c0,in_stack_000001b8,in_stack_000001f0,in_stack_000001f8,
               in_stack_00000200,in_stack_00000208,in_stack_00000210);
  }
  else {
    impute_missing_values_internal<double,long,double>
              (in_stack_000001e0,in_stack_000001d8,in_stack_000001d7,in_stack_000001c8,
               in_stack_000001c0,in_stack_000001b8,in_stack_000001f0,in_stack_000001f8,
               in_stack_00000200,in_stack_00000208,in_stack_00000210);
  }
  return;
}

Assistant:

void impute_missing_values(real_t numeric_data[], int categ_data[], bool is_col_major,
                           real_t Xr[], sparse_ix Xr_ind[], sparse_ix Xr_indptr[],
                           size_t nrows, bool use_long_double, int nthreads,
                           IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
                           Imputer &imputer)
{
    if (use_long_double && !has_long_double()) {
        use_long_double = false;
        print_errmsg("Passed 'use_long_double=true', but library was compiled without long double support.\n");
    }
    #ifndef NO_LONG_DOUBLE
    if (likely(!use_long_double))
    #endif
        impute_missing_values_internal<real_t, sparse_ix, double>(
            numeric_data, categ_data, is_col_major,
            Xr, Xr_ind, Xr_indptr,
            nrows, nthreads,
            model_outputs, model_outputs_ext,
            imputer
        );
    #ifndef NO_LONG_DOUBLE
    else
        impute_missing_values_internal<real_t, sparse_ix, long double>(
            numeric_data, categ_data, is_col_major,
            Xr, Xr_ind, Xr_indptr,
            nrows, nthreads,
            model_outputs, model_outputs_ext,
            imputer
        );
    #endif
}